

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O2

void __thiscall Fl_Widget::label(Fl_Widget *this,char *a)

{
  byte *pbVar1;
  char *__ptr;
  
  if ((this->flags_ & 0x400) != 0) {
    __ptr = (this->label_).value;
    if (__ptr == a) {
      return;
    }
    free(__ptr);
    pbVar1 = (byte *)((long)&this->flags_ + 1);
    *pbVar1 = *pbVar1 & 0xfb;
  }
  (this->label_).value = a;
  redraw_label(this);
  return;
}

Assistant:

void
Fl_Widget::label(const char *a) {
  if (flags() & COPIED_LABEL) {
    // reassigning a copied label remains the same copied label
    if (label_.value == a)
      return;
    free((void *)(label_.value));
    clear_flag(COPIED_LABEL);
  }
  label_.value=a;
  redraw_label();
}